

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

void __thiscall wasm::MultiMemoryLowering::Replacer::walkFunction(Replacer *this,Function *func)

{
  MultiMemoryLowering *pMVar1;
  pointer pNVar2;
  pointer pNVar3;
  
  pMVar1 = this->parent;
  pNVar3 = (pMVar1->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (pMVar1->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 != pNVar2) {
    do {
      if ((pNVar3->super_IString).str._M_str ==
          (func->super_Importable).super_Named.name.super_IString.str._M_str) {
        return;
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != pNVar2);
  }
  pNVar3 = (pMVar1->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (pMVar1->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 != pNVar2) {
    do {
      if ((pNVar3->super_IString).str._M_str ==
          (func->super_Importable).super_Named.name.super_IString.str._M_str) {
        return;
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != pNVar2);
  }
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  ).
  super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .
  super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .currFunction = func;
  Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  ::walk(&(this->
          super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
          ).
          super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
          .
          super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
         ,&func->body);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  ).
  super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .
  super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
  .currFunction = (Function *)0x0;
  return;
}

Assistant:

void walkFunction(Function* func) {
      for (Name funcName : parent.memorySizeNames) {
        if (funcName == func->name) {
          return;
        }
      }
      for (Name funcName : parent.memoryGrowNames) {
        if (funcName == func->name) {
          return;
        }
      }
      Super::walkFunction(func);
    }